

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

Int64 __thiscall Imf_2_5::Header::writeTo(Header *this,OStream *os,bool isTiled)

{
  bool bVar1;
  undefined4 uVar2;
  TypedAttribute<Imf_2_5::PreviewImage> *pTVar3;
  Attribute *pAVar4;
  TypedAttribute<Imf_2_5::PreviewImage> *pTVar5;
  long *in_RSI;
  string s;
  StdOSStream oss;
  ConstIterator i;
  Attribute *preview;
  Int64 previewPosition;
  int version;
  undefined4 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  StdOSStream *in_stack_fffffffffffffda0;
  StdOSStream *in_stack_fffffffffffffdb0;
  string local_208 [48];
  undefined1 local_1d8 [160];
  char *in_stack_fffffffffffffec8;
  Header *in_stack_fffffffffffffed0;
  Int64 local_20;
  
  local_20 = 0;
  pTVar3 = findTypedAttribute<Imf_2_5::TypedAttribute<Imf_2_5::PreviewImage>>
                     (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  begin((Header *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  while( true ) {
    end((Header *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    bVar1 = Imf_2_5::operator!=((ConstIterator *)in_stack_fffffffffffffda0,
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    if (!bVar1) break;
    ConstIterator::name((ConstIterator *)0x775c9b);
    Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
              (&in_stack_fffffffffffffda0->super_OStream,
               (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    pAVar4 = ConstIterator::attribute((ConstIterator *)0x775cbf);
    (*pAVar4->_vptr_Attribute[2])();
    Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
              (&in_stack_fffffffffffffda0->super_OStream,
               (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    StdOSStream::StdOSStream(in_stack_fffffffffffffdb0);
    pAVar4 = ConstIterator::attribute((ConstIterator *)0x775cef);
    (*pAVar4->_vptr_Attribute[4])(pAVar4,local_1d8,2);
    StdOSStream::str_abi_cxx11_
              ((StdOSStream *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    std::__cxx11::string::length();
    Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
              (&in_stack_fffffffffffffda0->super_OStream,in_stack_fffffffffffffd9c);
    pTVar5 = (TypedAttribute<Imf_2_5::PreviewImage> *)
             ConstIterator::attribute((ConstIterator *)0x775d5b);
    if (pTVar5 == pTVar3) {
      local_20 = (**(code **)(*in_RSI + 0x18))();
    }
    in_stack_fffffffffffffda0 = (StdOSStream *)local_208;
    in_stack_fffffffffffffdb0 = (StdOSStream *)std::__cxx11::string::data();
    uVar2 = std::__cxx11::string::length();
    (**(code **)(*in_RSI + 0x10))(in_RSI,in_stack_fffffffffffffdb0,uVar2);
    std::__cxx11::string::~string(local_208);
    StdOSStream::~StdOSStream(in_stack_fffffffffffffda0);
    ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffda0);
  }
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
            (&in_stack_fffffffffffffda0->super_OStream,
             (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  return local_20;
}

Assistant:

Int64
Header::writeTo (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os, bool isTiled) const
{
    //
    // Write a "magic number" to identify the file as an image file.
    // Write the current file format version number.
    //

    int version = EXR_VERSION;

    //
    // Write all attributes.  If we have a preview image attribute,
    // keep track of its position in the file.
    //

    Int64 previewPosition = 0;

    const Attribute *preview =
	    findTypedAttribute <PreviewImageAttribute> ("preview");

    for (ConstIterator i = begin(); i != end(); ++i)
    {
	//
	// Write the attribute's name and type.
	//

	OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, i.name());
	OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, i.attribute().typeName());

	//
	// Write the size of the attribute value,
	// and the value itself.
	//

	StdOSStream oss;
	i.attribute().writeValueTo (oss, version);

	std::string s = oss.str();
	OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, (int) s.length());

	if (&i.attribute() == preview)
	    previewPosition = os.tellp();

	os.write (s.data(), int(s.length()));
    }

    //
    // Write zero-length attribute name to mark the end of the header.
    //

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, "");

    return previewPosition;
}